

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

bool __thiscall
Lib::DHMap<Kernel::Literal_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::getValuePtr
          (DHMap<Kernel::Literal_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *this,
          Literal *key,uint **pval,uint *initial)

{
  Entry *pEVar1;
  uint *in_RCX;
  undefined8 *in_RDX;
  Literal *in_RSI;
  DHMap<Kernel::Literal_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *in_RDI;
  bool bVar2;
  bool exists;
  Entry *e;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  DHMap<Kernel::Literal_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  
  this_00 = in_RDI;
  ensureExpanded((DHMap<Kernel::Literal_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                 CONCAT17(in_stack_ffffffffffffffd7,
                          CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)));
  pEVar1 = findEntryToInsert(this_00,(Literal **)in_RSI);
  bVar2 = false;
  if ((uint)(pEVar1->field_0)._infoData >> 2 == in_RDI->_timestamp) {
    bVar2 = ((pEVar1->field_0)._infoData & 1U) == 0;
  }
  if (!bVar2) {
    if ((uint)(pEVar1->field_0)._infoData >> 2 == in_RDI->_timestamp) {
      in_RDI->_deleted = in_RDI->_deleted + -1;
    }
    else {
      (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 3U | in_RDI->_timestamp << 2;
      (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffd;
    }
    (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffe;
    pEVar1->_key = in_RSI;
    pEVar1->_val = *in_RCX;
    in_RDI->_size = in_RDI->_size + 1;
  }
  *in_RDX = &pEVar1->_val;
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool getValuePtr(Key key, Val*& pval, const Val& initial)
  {
    ensureExpanded();
    Entry* e=findEntryToInsert(key);
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key=key;
      e->_val=initial;
      _size++;
    }
    pval=&e->_val;
    return !exists;
  }